

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceNodeCloud.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChContactSurfaceNodeCloud::AddAllNodes
          (ChContactSurfaceNodeCloud *this,double point_radius)

{
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  uint uVar2;
  ChMesh *pCVar3;
  uint uVar4;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> mnodeFEArot;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnodeFEA;
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> local_50;
  undefined1 local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  pCVar3 = (this->super_ChContactSurface).m_mesh;
  if (pCVar3 != (ChMesh *)0x0) {
    uVar4 = 0;
    while( true ) {
      uVar2 = (*(pCVar3->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3c])();
      if (uVar2 <= uVar4) break;
      pCVar3 = (this->super_ChContactSurface).m_mesh;
      (*(pCVar3->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3d])
                (&local_80,pCVar3,(ulong)uVar4);
      std::dynamic_pointer_cast<chrono::fea::ChNodeFEAxyz,chrono::ChNodeBase>
                ((shared_ptr<chrono::ChNodeBase> *)&local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
      if (local_70._M_ptr == (element_type *)0x0) {
        pCVar3 = (this->super_ChContactSurface).m_mesh;
        (*(pCVar3->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3d])
                  (local_40,pCVar3,(ulong)uVar4);
        std::dynamic_pointer_cast<chrono::fea::ChNodeFEAxyzrot,chrono::ChNodeBase>
                  ((shared_ptr<chrono::ChNodeBase> *)&local_80);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
        if (local_80._M_ptr != (element_type *)0x0) {
          std::__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_60,&local_80);
          AddNode(this,(shared_ptr<chrono::fea::ChNodeFEAxyzrot> *)&local_60,point_radius);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
        }
        p_Var1 = &local_80;
      }
      else {
        std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)&local_50,
                   &local_70);
        AddNode(this,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)&local_50,point_radius);
        p_Var1 = &local_50;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
      pCVar3 = (this->super_ChContactSurface).m_mesh;
      uVar4 = uVar4 + 1;
    }
  }
  return;
}

Assistant:

void ChContactSurfaceNodeCloud::AddAllNodes(const double point_radius) {
    if (!m_mesh)
        return;
    for (unsigned int i = 0; i < m_mesh->GetNnodes(); ++i)
        if (auto mnodeFEA = std::dynamic_pointer_cast<ChNodeFEAxyz>(m_mesh->GetNode(i)))
            this->AddNode(mnodeFEA, point_radius);
        else if (auto mnodeFEArot = std::dynamic_pointer_cast<ChNodeFEAxyzrot>(m_mesh->GetNode(i)))
            this->AddNode(mnodeFEArot, point_radius);
}